

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::BuildDecompressedPathsImpl
          (CrateReader *this,BuildDecompressedPathsArg *arg)

{
  uint uVar1;
  size_t sVar2;
  pointer puVar3;
  pointer pTVar4;
  pointer piVar5;
  uint uVar6;
  vector<bool,_std::allocator<bool>_> *this_00;
  _Elt_pointer puVar7;
  ostream *poVar8;
  pointer pPVar9;
  pointer pcVar10;
  pointer pcVar11;
  vector<int,_std::allocator<int>_> *pvVar12;
  CrateReader *pCVar13;
  bool bVar14;
  string *elem;
  int iVar15;
  pointer pcVar16;
  _Elt_pointer pPVar17;
  char *pcVar18;
  string *psVar19;
  unsigned_long *in_R8;
  vector<int,_std::allocator<int>_> *pvVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar21;
  ulong uVar22;
  reference rVar23;
  size_t idx;
  size_t subtreeStartIdx;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> startIndexStack;
  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>
  parentPathStack;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> endIndexStack;
  ostringstream ss_e;
  Path parentPath;
  Path rootPath;
  allocator local_4c9;
  undefined1 local_4c8 [56];
  ulong local_490;
  ulong local_488;
  pointer local_480;
  vector<int,_std::allocator<int>_> *local_478;
  vector<bool,_std::allocator<bool>_> *local_470;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_468;
  vector<int,_std::allocator<int>_> *local_460;
  pointer local_458 [4];
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_438;
  stack<tinyusdz::Path,_std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_> local_3e8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  Path local_348;
  Path local_1d0;
  Path local_100;
  
  if (arg == (BuildDecompressedPathsArg *)0x0) {
    return false;
  }
  Path::Path(&local_1d0,&arg->parentPath);
  pvVar21 = arg->pathIndexes;
  if ((((pvVar21 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) &&
       (pvVar20 = arg->elementTokenIndexes, pvVar20 != (vector<int,_std::allocator<int>_> *)0x0)) &&
      (pvVar12 = arg->jumps, pvVar12 != (vector<int,_std::allocator<int>_> *)0x0)) &&
     (local_470 = arg->visit_table, local_470 != (vector<bool,_std::allocator<bool>_> *)0x0)) {
    Path::make_root_path();
    sVar2 = (this->_config).maxPathIndicesDecodeIteration;
    local_4c8._16_8_ = this;
    ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
    stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &local_438);
    ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
    stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
              ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               &local_398);
    ::std::stack<tinyusdz::Path,std::deque<tinyusdz::Path,std::allocator<tinyusdz::Path>>>::
    stack<std::deque<tinyusdz::Path,std::allocator<tinyusdz::Path>>,void>(&local_3e8);
    pcVar10 = (pointer)arg->startIndex;
    uVar22 = 0;
    pcVar11 = (pointer)arg->endIndex;
    local_488 = sVar2;
    local_478 = pvVar12;
    local_468 = pvVar21;
    local_460 = pvVar20;
LAB_0018179f:
    pCVar13 = (CrateReader *)local_4c8._16_8_;
    local_490 = uVar22;
    if (uVar22 < local_488) {
      local_480 = pcVar11 + 1;
LAB_001817ba:
      uVar22 = local_490;
      local_4c8._8_8_ = pcVar10;
      if (local_480 <= pcVar10) goto LAB_00181b07;
      if (((local_1d0._prim_part._M_string_length != 0) ||
          (local_1d0._variant_part._M_string_length != 0)) ||
         (local_1d0._prop_part._M_string_length != 0)) {
        piVar5 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((pointer)((long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= pcVar10) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
          poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11a3);
          ::std::operator<<(poVar8," ");
          pcVar18 = "Index exceeds elementTokenIndexes.size()";
          goto LAB_00181d73;
        }
        uVar1 = piVar5[(long)pcVar10];
        uVar6 = -uVar1;
        if (0 < (int)uVar1) {
          uVar6 = uVar1;
        }
        pTVar4 = (pCVar13->_tokens).
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)uVar6 <
            (ulong)((long)(pCVar13->_tokens).
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5)) {
          pcVar10 = (pointer)(ulong)(local_468->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start[(long)pcVar10];
          local_4c8._0_8_ = pcVar10;
          if (pcVar10 < (pointer)(((long)(pCVar13->_paths).
                                         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pCVar13->_paths).
                                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
            if (pcVar10 < (pointer)(((long)(pCVar13->_elemPaths).
                                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pCVar13->_elemPaths).
                                          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
              if ((pcVar10 < (pointer)((ulong)(local_470->super__Bvector_base<std::allocator<bool>_>
                                              )._M_impl.super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_offset +
                                      ((long)(local_470->super__Bvector_base<std::allocator<bool>_>)
                                             ._M_impl.super__Bvector_impl_data._M_finish.
                                             super__Bit_iterator_base._M_p -
                                      (long)(local_470->super__Bvector_base<std::allocator<bool>_>).
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p) * 8)) &&
                 (rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (local_470,(size_type)pcVar10),
                 (*rVar23._M_p & rVar23._M_mask) != 0)) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
                poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
                poVar8 = ::std::operator<<(poVar8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar8 = ::std::operator<<(poVar8,"[Crate]");
                poVar8 = ::std::operator<<(poVar8,":");
                poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
                poVar8 = ::std::operator<<(poVar8,"():");
                poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11c2);
                ::std::operator<<(poVar8," ");
                ::std::__cxx11::string::string
                          ((string *)local_458,
                           "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                           ,&local_4c9);
                fmt::format<unsigned_long,unsigned_long>
                          ((string *)(local_4c8 + 0x18),(fmt *)local_458,(string *)local_4c8,
                           (unsigned_long *)(local_4c8 + 8),in_R8);
                poVar8 = ::std::operator<<((ostream *)&local_348,(string *)(local_4c8 + 0x18));
                ::std::operator<<(poVar8,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                goto LAB_0018254c;
              }
              elem = &pTVar4[uVar6].str_;
              if ((int)uVar1 < 0) {
                Path::AppendProperty(&local_348,&local_1d0,elem);
              }
              else {
                Path::AppendElement(&local_348,&local_1d0,elem);
              }
              pCVar13 = (CrateReader *)local_4c8._16_8_;
              Path::operator=((((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               (local_4c8._16_8_ + 0xd0))->
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                              _M_impl.super__Vector_impl_data._M_start + (long)pcVar10,&local_348);
              Path::~Path(&local_348);
              ::std::__cxx11::string::string((string *)(local_4c8 + 0x18),"",(allocator *)local_458)
              ;
              Path::Path(&local_348,elem,(string *)(local_4c8 + 0x18));
              Path::operator=((((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               ((long)pCVar13 + 0xe8))->
                              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                              _M_impl.super__Vector_impl_data._M_start + (long)pcVar10,&local_348);
              Path::~Path(&local_348);
              ::std::__cxx11::string::_M_dispose();
              rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (local_470,(size_type)pcVar10);
              *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
              pvVar12 = local_478;
              pvVar20 = local_460;
              pvVar21 = local_468;
              goto LAB_00181a32;
            }
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
            poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11bc);
            ::std::operator<<(poVar8," ");
            poVar8 = ::std::operator<<((ostream *)&local_348,"Index is out-of-range");
            ::std::operator<<(poVar8,"\n");
LAB_0018254c:
            ::std::__cxx11::stringbuf::str();
            pCVar13 = (CrateReader *)local_4c8._16_8_;
            goto LAB_00182566;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
          poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11b7);
          ::std::operator<<(poVar8," ");
          pcVar18 = "Index is out-of-range";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
          poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11ae);
          ::std::operator<<(poVar8," ");
          pcVar18 = "Invalid tokenIndex in BuildDecompressedPathsImpl.";
        }
        poVar8 = ::std::operator<<((ostream *)&local_348,pcVar18);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::stringbuf::str();
        psVar19 = (string *)&pCVar13->_err;
        goto LAB_00181da9;
      }
      Path::operator=(&local_1d0,&local_100);
      this_00 = local_470;
      puVar3 = (pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pointer)((long)(pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <=
          (ulong)local_4c8._8_8_) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
        poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x118f);
        ::std::operator<<(poVar8," ");
        pcVar18 = "Index exceeds pathIndexes.size()";
        goto LAB_00181d73;
      }
      pcVar10 = (pointer)(ulong)puVar3[local_4c8._8_8_];
      pPVar9 = (pCVar13->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4c8._0_8_ = pcVar10;
      if (pcVar10 < (pointer)(((long)(pCVar13->_paths).
                                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) /
                             0xd0)) {
        if (pcVar10 < (pointer)((ulong)(local_470->super__Bvector_base<std::allocator<bool>_>).
                                       _M_impl.super__Bvector_impl_data._M_finish.
                                       super__Bit_iterator_base._M_offset +
                               ((long)(local_470->super__Bvector_base<std::allocator<bool>_>).
                                      _M_impl.super__Bvector_impl_data._M_finish.
                                      super__Bit_iterator_base._M_p -
                               (long)(local_470->super__Bvector_base<std::allocator<bool>_>)._M_impl
                                     .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                     _M_p) * 8)) {
          rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                             (local_470,(size_type)pcVar10);
          if ((*rVar23._M_p & rVar23._M_mask) == 0) {
            pPVar9 = (pCVar13->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            goto LAB_0018188a;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
          poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[Crate]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x119b);
          ::std::operator<<(poVar8," ");
          ::std::__cxx11::string::string
                    ((string *)local_458,
                     "Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data."
                     ,&local_4c9);
          fmt::format<unsigned_long,unsigned_long>
                    ((string *)(local_4c8 + 0x18),(fmt *)local_458,(string *)local_4c8,
                     (unsigned_long *)(local_4c8 + 8),in_R8);
          poVar8 = ::std::operator<<((ostream *)&local_348,(string *)(local_4c8 + 0x18));
          ::std::operator<<(poVar8,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          goto LAB_00181d8a;
        }
LAB_0018188a:
        Path::operator=(pPVar9 + (long)pcVar10,&local_1d0);
        rVar23 = ::std::vector<bool,_std::allocator<bool>_>::operator[](this_00,local_4c8._0_8_);
        *rVar23._M_p = *rVar23._M_p | rVar23._M_mask;
LAB_00181a32:
        piVar5 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar10 = (pointer)((long)(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
        if (pcVar10 <= (ulong)local_4c8._8_8_) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
          poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
          poVar8 = ::std::operator<<(poVar8,"():");
          iVar15 = 0x11d8;
          goto LAB_0018235b;
        }
        iVar15 = piVar5[local_4c8._8_8_];
        if ((long)iVar15 < 1) {
          if (iVar15 == -1) {
LAB_00181aa6:
            uVar22 = (ulong)(pvVar21->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[local_4c8._8_8_];
            pPVar9 = (pCVar13->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pCVar13->_paths).
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) / 0xd0) <=
                uVar22) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
              poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
              poVar8 = ::std::operator<<(poVar8,"():");
              iVar15 = 0x1225;
              goto LAB_0018235b;
            }
            Path::operator=(&local_1d0,pPVar9 + uVar22);
          }
          pcVar10 = (pointer)(local_4c8._8_8_ + 1);
          goto LAB_001817ba;
        }
        pcVar11 = (pointer)(local_4c8._8_8_ + (long)iVar15);
        pcVar16 = pcVar11;
        if (pcVar11 < pcVar10) {
          while( true ) {
            local_4c8._0_8_ = pcVar10;
            local_458[0] = pcVar11;
            if (pcVar10 <= pcVar16) goto LAB_00181cf5;
            if (piVar5[(long)pcVar16] < -1) break;
            pcVar16 = pcVar16 + 1;
          }
          local_4c8._0_8_ = pcVar16;
          if (pcVar10 <= pcVar16) {
LAB_00181cf5:
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
            poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11fb);
            ::std::operator<<(poVar8," ");
            pcVar18 = "jump indices seems corrupted.";
            goto LAB_00181d73;
          }
          pvVar12 = local_478;
          if (pcVar16 < pcVar11) goto LAB_00181aa6;
          if (iVar15 != 1) {
            local_348._prim_part._M_dataplus._M_p = (pointer)(local_4c8._8_8_ + 1);
            ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_438,
                       (unsigned_long *)&local_348);
            local_348._prim_part._M_dataplus._M_p = pcVar11 + -1;
            ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_398,
                       (unsigned_long *)&local_348);
            uVar22 = (ulong)(pvVar21->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[local_4c8._8_8_];
            pPVar9 = (pCVar13->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)(((long)(pCVar13->_paths).
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pPVar9) / 0xd0) <=
                uVar22) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
              poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
              poVar8 = ::std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar8 = ::std::operator<<(poVar8,":");
              poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
              poVar8 = ::std::operator<<(poVar8,"():");
              iVar15 = 0x120d;
              goto LAB_0018235b;
            }
            ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                      (&local_3e8.c,pPVar9 + uVar22);
          }
          ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_438,
                     (value_type_conflict7 *)local_458);
          ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_398,
                     (value_type_conflict7 *)local_4c8);
          ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                    (&local_3e8.c,&local_1d0);
          pvVar12 = local_478;
          uVar22 = local_490 + 1;
          goto LAB_00181b07;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
        poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x11e6);
        ::std::operator<<(poVar8," ");
        pcVar18 = "jump index corrupted.";
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
        poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
        poVar8 = ::std::operator<<(poVar8,"():");
        iVar15 = 0x1195;
LAB_0018235b:
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,iVar15);
        ::std::operator<<(poVar8," ");
        pcVar18 = "Index is out-of-range";
      }
LAB_00181d73:
      poVar8 = ::std::operator<<((ostream *)&local_348,pcVar18);
      ::std::operator<<(poVar8,"\n");
LAB_00181d8a:
      ::std::__cxx11::stringbuf::str();
      psVar19 = (string *)&pCVar13->_err;
      goto LAB_00181da9;
    }
    goto LAB_00181ffc;
  }
  bVar14 = false;
LAB_00181ccb:
  Path::~Path(&local_1d0);
  return bVar14;
LAB_00181b07:
  if (local_438._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_438._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00181ffc;
  puVar7 = local_438._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_438._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_438._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar7 = local_438._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pcVar10 = (pointer)puVar7[-1];
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_438);
  puVar7 = local_398._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_398._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_398._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar7 = local_398._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_480 = (pointer)puVar7[-1];
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_398);
  pPVar17 = local_3e8.c.super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (local_3e8.c.super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      local_3e8.c.super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pPVar17 = local_3e8.c.super__Deque_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  Path::operator=(&local_1d0,pPVar17 + -1);
  ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::pop_back(&local_3e8.c);
  uVar22 = uVar22 + 1;
  pcVar11 = local_480;
  goto LAB_0018179f;
LAB_00181ffc:
  bVar14 = true;
  if (local_488 <= uVar22) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
    poVar8 = ::std::operator<<((ostream *)&local_348,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"BuildDecompressedPathsImpl");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1241);
    ::std::operator<<(poVar8," ");
    poVar8 = ::std::operator<<((ostream *)&local_348,"PathIndex tree Too deep.");
    ::std::operator<<(poVar8,"\n");
    ::std::__cxx11::stringbuf::str();
LAB_00182566:
    psVar19 = (string *)&pCVar13->_err;
LAB_00181da9:
    ::std::__cxx11::string::append(psVar19);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_348);
    bVar14 = false;
  }
  ::std::deque<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~deque(&local_3e8.c);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_398);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_438);
  Path::~Path(&local_100);
  goto LAB_00181ccb;
}

Assistant:

bool CrateReader::BuildDecompressedPathsImpl(
    BuildDecompressedPathsArg *arg) {

  if (!arg) {
    return false;
  }

  Path parentPath = arg->parentPath;
  if (!arg->pathIndexes) {
    return false;
  }
  if (!arg->elementTokenIndexes) {
    return false;
  }
  if (!arg->jumps) {
    return false;
  }
  if (!arg->visit_table) {
    return false;
  }
  auto &pathIndexes = *arg->pathIndexes;
  auto &elementTokenIndexes = *arg->elementTokenIndexes;
  auto &jumps = *arg->jumps;
  auto &visit_table = *arg->visit_table;

  auto rootPath = Path::make_root_path();

  const size_t maxIter = _config.maxPathIndicesDecodeIteration;

  std::stack<size_t> startIndexStack;
  std::stack<size_t> endIndexStack;
  std::stack<Path> parentPathStack;

  size_t nIter = 0;

  size_t startIndex = arg->startIndex;
  size_t endIndex = arg->endIndex;

  while (nIter < maxIter) {

    DCOUT("startIndex = " << startIndex << ", endIdx = " << endIndex);

    for (size_t thisIndex = startIndex; thisIndex < (endIndex + 1); thisIndex++) {
      //auto thisIndex = curIndex++;
      DCOUT("thisIndex = " << thisIndex << ", pathIndexes.size = " << pathIndexes.size());
      if (parentPath.is_empty()) {
        // root node.
        // Assume single root node in the scene.
        DCOUT("paths[" << pathIndexes[thisIndex]
                       << "] is parent. name = " << parentPath.full_path_name());
        parentPath = rootPath;

        if (thisIndex >= pathIndexes.size()) {
          PUSH_ERROR("Index exceeds pathIndexes.size()");
          return false;
        }

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        _paths[idx] = parentPath;
        visit_table[idx] = true;
      } else {
        if (thisIndex >= elementTokenIndexes.size()) {
          PUSH_ERROR("Index exceeds elementTokenIndexes.size()");
          return false;
        }
        int32_t _tokenIndex = elementTokenIndexes[thisIndex];
        DCOUT("elementTokenIndex = " << _tokenIndex);
        bool isPrimPropertyPath = _tokenIndex < 0;
        // ~0 returns -2147483648, so cast to uint32
        uint32_t tokenIndex = uint32_t(isPrimPropertyPath ? -_tokenIndex : _tokenIndex);

        DCOUT("tokenIndex = " << tokenIndex << ", _tokens.size = " << _tokens.size());
        if (tokenIndex >= _tokens.size()) {
          PUSH_ERROR("Invalid tokenIndex in BuildDecompressedPathsImpl.");
          return false;
        }
        auto const &elemToken = _tokens[size_t(tokenIndex)];
        DCOUT("elemToken = " << elemToken);
        DCOUT("[" << pathIndexes[thisIndex] << "].append = " << elemToken);

        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx >= _elemPaths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        if (idx < visit_table.size()) {
          if (visit_table[idx]) {
            PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Circular referencing of Path index {}(thisIndex {}) detected. Invalid Paths data.", idx, thisIndex));
          }
        }

        // Reconstruct full path
        _paths[idx] =
            isPrimPropertyPath ? parentPath.AppendProperty(elemToken.str())
                               : parentPath.AppendElement(elemToken.str()); // prim, variantSelection, etc.

        // also set leaf path for 'primChildren' check
        _elemPaths[idx] = Path(elemToken.str(), "");
        //_paths[pathIndexes[thisIndex]].SetLocalPart(elemToken.str());

        visit_table[idx] = true;
      }

      // If we have either a child or a sibling but not both, then just
      // continue to the neighbor.  If we have both then spawn a task for the
      // sibling and do the child ourself.  We think that our path trees tend
      // to be broader more often than deep.

      if (thisIndex >= jumps.size()) {
        PUSH_ERROR("Index is out-of-range");
        return false;
      }

      bool hasChild = (jumps[thisIndex] > 0) || (jumps[thisIndex] == -1);
      bool hasSibling = (jumps[thisIndex] >= 0);
      DCOUT("hasChild = " << hasChild << ", hasSibling = " << hasSibling);

      if (hasChild) {
        if (hasSibling) {
          // NOTE(syoyo): This recursive call can be parallelized
          auto siblingIndex = thisIndex + size_t(jumps[thisIndex]);

          if (siblingIndex >= jumps.size()) {
            PUSH_ERROR_AND_RETURN("jump index corrupted.");
          }

          // Find subtree end.
          size_t subtreeStartIdx = siblingIndex;
          size_t subtreeIdx = subtreeStartIdx;

          for (; subtreeIdx < jumps.size(); subtreeIdx++) {

            bool has_child = (jumps[subtreeIdx] > 0) || (jumps[subtreeIdx] == -1);
            bool has_sibling = (jumps[subtreeIdx] >= 0);

            if (has_child || has_sibling) {
              continue;
            }
            break;
          }

          size_t subtreeEndIdx = subtreeIdx;
          if (subtreeEndIdx >= jumps.size()) {
            // Guess corrupted.
            PUSH_ERROR_AND_RETURN("jump indices seems corrupted.");
          }

          DCOUT("subtree startIdx " << subtreeStartIdx << ", subtree endIndex " << subtreeEndIdx);

          if (subtreeEndIdx >= subtreeStartIdx) {

            // index range after traversing subtree
            if (jumps[thisIndex] > 1) {

                // Setup stacks to resume loop from [Cont.]
                startIndexStack.push(thisIndex+1);
                // jumps should be always positive, so no siblingIndex < thisIndex
                endIndexStack.push(siblingIndex-1); // endIndex is inclusive so subtract 1.

                {
                  size_t idx = pathIndexes[thisIndex];
                  if (idx >= _paths.size()) {
                    PUSH_ERROR("Index is out-of-range");
                    return false;
                  }

                  parentPathStack.push(_paths[idx]);
                }
            }

            startIndexStack.push(subtreeStartIdx);
            endIndexStack.push(subtreeEndIdx);

            parentPathStack.push(parentPath);
            DCOUT("stack size: " << startIndexStack.size());

            nIter++;

            break; // goto `(A)`
          }

        }

        // [Cont.]
        size_t idx = pathIndexes[thisIndex];
        if (idx >= _paths.size()) {
          PUSH_ERROR("Index is out-of-range");
          return false;
        }

        parentPath = _paths[idx];

      }
    }

    // (A)

    if (startIndexStack.empty()) {
      break; // end traversal
    }

    startIndex = startIndexStack.top();
    startIndexStack.pop();

    endIndex = endIndexStack.top();
    endIndexStack.pop();

    parentPath = parentPathStack.top();
    parentPathStack.pop();

    nIter++;
  }

  if (nIter >= maxIter) {
    PUSH_ERROR_AND_RETURN("PathIndex tree Too deep.");
  }

  return true;
}